

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eLut.cpp
# Opt level: O3

int main(void)

{
  long lVar1;
  ostream *poVar2;
  int i;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  unsigned_short eLut [512];
  undefined1 local_428 [512];
  undefined1 auStack_228 [512];
  
  iVar3 = 4;
  iVar4 = 5;
  iVar5 = 6;
  iVar6 = 7;
  iVar7 = 0;
  iVar8 = 1;
  iVar9 = 2;
  iVar10 = 3;
  lVar1 = 0;
  auVar11 = _DAT_00102030;
  do {
    auVar14._0_4_ = -(uint)((int)(iVar7 - 0x8eU ^ 0x80000000) < 0x7fffffe3);
    auVar14._4_4_ = -(uint)((int)(iVar8 - 0x8eU ^ 0x80000000) < 0x7fffffe3);
    auVar14._8_4_ = -(uint)((int)(iVar9 - 0x8eU ^ 0x80000000) < 0x7fffffe3);
    auVar14._12_4_ = -(uint)((int)(iVar10 - 0x8eU ^ 0x80000000) < 0x7fffffe3);
    auVar15._0_4_ = -(uint)((int)(iVar3 - 0x8eU ^ 0x80000000) < 0x7fffffe3);
    auVar15._4_4_ = -(uint)((int)(iVar4 - 0x8eU ^ 0x80000000) < 0x7fffffe3);
    auVar15._8_4_ = -(uint)((int)(iVar5 - 0x8eU ^ 0x80000000) < 0x7fffffe3);
    auVar15._12_4_ = -(uint)((int)(iVar6 - 0x8eU ^ 0x80000000) < 0x7fffffe3);
    auVar15 = packssdw(auVar14,auVar15);
    auVar12 = psllw(auVar11,10);
    auVar13._0_2_ = auVar12._0_2_ + 0x4000;
    auVar13._2_2_ = auVar12._2_2_ + 0x4000;
    auVar13._4_2_ = auVar12._4_2_ + 0x4000;
    auVar13._6_2_ = auVar12._6_2_ + 0x4000;
    auVar13._8_2_ = auVar12._8_2_ + 0x4000;
    auVar13._10_2_ = auVar12._10_2_ + 0x4000;
    auVar13._12_2_ = auVar12._12_2_ + 0x4000;
    auVar13._14_2_ = auVar12._14_2_ + 0x4000;
    *(undefined1 (*) [16])(local_428 + lVar1 * 2) = ~auVar15 & auVar13;
    *(undefined1 (*) [16])(auStack_228 + lVar1 * 2) = ~auVar15 & (auVar13 | _DAT_00102080);
    lVar1 = lVar1 + 8;
    iVar7 = iVar7 + 8;
    iVar8 = iVar8 + 8;
    iVar9 = iVar9 + 8;
    iVar10 = iVar10 + 8;
    iVar3 = iVar3 + 8;
    iVar4 = iVar4 + 8;
    iVar5 = iVar5 + 8;
    iVar6 = iVar6 + 8;
    auVar12._0_2_ = auVar11._0_2_ + 8;
    auVar12._2_2_ = auVar11._2_2_ + 8;
    auVar12._4_2_ = auVar11._4_2_ + 8;
    auVar12._6_2_ = auVar11._6_2_ + 8;
    auVar12._8_2_ = auVar11._8_2_ + 8;
    auVar12._10_2_ = auVar11._10_2_ + 8;
    auVar12._12_2_ = auVar11._12_2_ + 8;
    auVar12._14_2_ = auVar11._14_2_ + 8;
    auVar11 = auVar12;
  } while (lVar1 != 0x100);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "//\n// This is an automatically generated file.\n// Do not edit.\n//\n\n",0x43);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"{\n    ",6);
  lVar1 = 0;
  do {
    *(undefined8 *)(_ITM_deregisterTMCloneTable + *(long *)(std::cout + -0x18)) = 5;
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
    if ((~(uint)lVar1 & 7) == 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
      if (lVar1 == 0x1ff) break;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"    ",4);
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x200);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"};\n",3);
  return 0;
}

Assistant:

int
main ()
{
    const int tableSize = 1 << 9;
    unsigned short eLut[tableSize];
    initELut (eLut);

    cout << "//\n"
	    "// This is an automatically generated file.\n"
	    "// Do not edit.\n"
	    "//\n\n";

    cout << "{\n    ";

    for (int i = 0; i < tableSize; i++)
    {
	cout << setw (5) << eLut[i] << ", ";

	if (i % 8 == 7)
	{
	    cout << "\n";

	    if (i < tableSize - 1)
		cout << "    ";
	}
    }

    cout << "};\n";
    return 0;
}